

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MS3DImporter::InternReadFile
          (MS3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pTVar1;
  pointer *ppuVar2;
  _Rb_tree_node_base *p_Var3;
  aiColor4D *ambient;
  _Rb_tree_color _Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  long *plVar12;
  undefined8 *puVar13;
  void *pvVar14;
  pointer pTVar15;
  pointer pTVar16;
  pointer pTVar17;
  char cVar18;
  unsigned_short uVar19;
  unsigned_short uVar20;
  short sVar21;
  unsigned_short uVar22;
  int iVar23;
  ai_uint32 aVar24;
  undefined4 extraout_var;
  char *pcVar25;
  Logger *pLVar26;
  aiMaterial **ppaVar27;
  aiMaterial *this_00;
  size_t sVar28;
  aiMesh **__s;
  aiMesh *paVar29;
  ulong *puVar30;
  aiFace *paVar31;
  aiVector3D *paVar32;
  uint *puVar33;
  ulong uVar34;
  mapped_type *pmVar35;
  aiBone **__s_00;
  aiBone *paVar36;
  aiVertexWeight *paVar37;
  undefined8 uVar38;
  aiNode *this_01;
  aiNode **ppaVar39;
  aiNode *this_02;
  aiAnimation **ppaVar40;
  aiAnimation *paVar41;
  aiNodeAnim **__s_01;
  aiNodeAnim *paVar42;
  aiQuatKey *paVar43;
  aiVectorKey *paVar44;
  pointer pTVar45;
  runtime_error *prVar46;
  aiFace *paVar47;
  ulong uVar48;
  ulong uVar49;
  _Rb_tree_node_base *p_Var50;
  _Rb_tree_node_base *p_Var51;
  aiQuatKey *paVar52;
  ulong uVar53;
  uint uVar54;
  ulong uVar55;
  float *pInput;
  const_iterator it;
  pointer pTVar56;
  long lVar57;
  ulong uVar58;
  uint i;
  long lVar59;
  pointer pTVar60;
  bool bVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
  materials;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_> joints;
  StreamReaderLE stream;
  vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_> groups;
  vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
  vertices;
  char head [10];
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
  triangles;
  aiString tmp;
  int sm;
  long local_990;
  long local_980;
  long local_978;
  uint local_954;
  long *local_940;
  ulong local_938;
  long local_930 [2];
  pointer local_920;
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
  local_918;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
  local_900;
  StreamReader<false,_false> local_8e8;
  vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
  local_8b0;
  float local_894;
  float local_890;
  float local_88c;
  float local_888;
  float local_884;
  vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
  local_880;
  long local_868;
  short local_860;
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
  local_858;
  undefined1 local_840 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_830;
  _Rb_tree_node_base *local_820;
  ulong local_818;
  ios_base local_7d0 [256];
  _Alloc_hider local_6d0;
  size_type local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0 [40];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_438 [43];
  
  local_840._0_8_ = &local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"rb","");
  iVar23 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_840._0_8_);
  StreamReader<false,_false>::StreamReader
            (&local_8e8,(IOStream *)CONCAT44(extraout_var,iVar23),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._0_8_ != &local_830) {
    operator_delete((void *)local_840._0_8_,(ulong)(local_830._M_allocated_capacity + 1));
  }
  this->mScene = pScene;
  plVar12 = (long *)CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current);
  StreamReader<false,_false>::SetPtr(&local_8e8,(int8_t *)((long)plVar12 + 10));
  local_860 = (short)plVar12[1];
  local_868 = *plVar12;
  iVar23 = StreamReader<false,_false>::Get<int>(&local_8e8);
  if (local_860 != 0x3030 || local_868 != 0x303030304433534d) {
    prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840,
                   "Not a MS3D file, magic string MS3D000000 not found: ",pFile);
    std::runtime_error::runtime_error(prVar46,(string *)local_840);
    *(undefined ***)prVar46 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar46,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (iVar23 != 4) {
    prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_840._0_8_ = &local_830;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_840,"MS3D: Unsupported file format version, 4 was expected","");
    std::runtime_error::runtime_error(prVar46,(string *)local_840);
    *(undefined ***)prVar46 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar46,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar19 = StreamReader<false,_false>::Get<unsigned_short>(&local_8e8);
  std::vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>::
  vector(&local_880,(ulong)uVar19,(allocator_type *)local_840);
  if (uVar19 != 0) {
    lVar59 = 0;
    do {
      pTVar16 = local_880.
                super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      StreamReader<false,_false>::IncPtr(&local_8e8,1);
      ReadVector(&local_8e8,(aiVector3D *)((long)pTVar16->bone_id + lVar59 + -0xc));
      cVar18 = StreamReader<false,_false>::Get<signed_char>(&local_8e8);
      *(int *)((long)pTVar16->bone_id + lVar59) = (int)cVar18;
      cVar18 = StreamReader<false,_false>::Get<signed_char>(&local_8e8);
      *(int *)((long)pTVar16->weights + lVar59 + -4) = (int)cVar18;
      *(undefined4 *)((long)pTVar16->bone_id + lVar59 + 0xc) = 0xffffffff;
      *(undefined8 *)((long)pTVar16->bone_id + lVar59 + 4) = 0xffffffffffffffff;
      *(undefined8 *)((long)pTVar16->weights + lVar59 + 8) = 0;
      *(undefined8 *)((long)pTVar16->weights + lVar59) = 0x3f800000;
      lVar59 = lVar59 + 0x30;
    } while ((ulong)uVar19 * 0x30 != lVar59);
  }
  uVar20 = StreamReader<false,_false>::Get<unsigned_short>(&local_8e8);
  std::
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>::
  vector(&local_858,(ulong)uVar20,(allocator_type *)local_840);
  if (uVar20 != 0) {
    local_980 = 0x30;
    local_978 = 0x34;
    local_990 = 0;
    uVar55 = 0;
    do {
      pTVar17 = local_858.
                super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                ._M_impl.super__Vector_impl_data._M_start;
      StreamReader<false,_false>::IncPtr(&local_8e8,2);
      lVar59 = 0;
      do {
        sVar21 = StreamReader<false,_false>::Get<short>(&local_8e8);
        *(int *)((long)pTVar17->indices + lVar59 * 4 + local_990) = (int)sVar21;
        lVar59 = lVar59 + 1;
      } while (lVar59 != 3);
      lVar59 = 0xc;
      do {
        ReadVector(&local_8e8,(aiVector3D *)((long)pTVar17->indices + lVar59 + local_990));
        lVar59 = lVar59 + 0xc;
      } while (lVar59 != 0x30);
      lVar59 = 0;
      do {
        fVar62 = StreamReader<false,_false>::Get<float>(&local_8e8);
        *(float *)((long)pTVar17->indices + lVar59 * 8 + local_980) = fVar62;
        lVar59 = lVar59 + 1;
      } while (lVar59 != 3);
      lVar59 = 0;
      do {
        fVar62 = StreamReader<false,_false>::Get<float>(&local_8e8);
        *(float *)((long)pTVar17->indices + lVar59 * 8 + local_978) = fVar62;
        lVar59 = lVar59 + 1;
      } while (lVar59 != 3);
      cVar18 = StreamReader<false,_false>::Get<signed_char>(&local_8e8);
      pTVar17[uVar55].sg = (int)cVar18;
      cVar18 = StreamReader<false,_false>::Get<signed_char>(&local_8e8);
      pTVar17[uVar55].group = (int)cVar18;
      uVar55 = uVar55 + 1;
      local_990 = local_990 + 0x50;
      local_980 = local_980 + 0x50;
      local_978 = local_978 + 0x50;
    } while (uVar55 != uVar20);
  }
  uVar20 = StreamReader<false,_false>::Get<unsigned_short>(&local_8e8);
  std::vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>::
  vector(&local_8b0,(ulong)uVar20,(allocator_type *)local_840);
  if (uVar20 == 0) {
    bVar61 = false;
  }
  else {
    uVar55 = 0;
    bVar61 = false;
    do {
      pTVar60 = local_8b0.
                super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar55;
      StreamReader<false,_false>::IncPtr(&local_8e8,1);
      puVar13 = (undefined8 *)CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current);
      StreamReader<false,_false>::SetPtr(&local_8e8,(int8_t *)(puVar13 + 4));
      uVar38 = *puVar13;
      uVar10 = puVar13[1];
      uVar11 = puVar13[3];
      *(undefined8 *)(pTVar60->name + 0x10) = puVar13[2];
      *(undefined8 *)(pTVar60->name + 0x18) = uVar11;
      *(undefined8 *)pTVar60->name = uVar38;
      *(undefined8 *)(pTVar60->name + 8) = uVar10;
      pTVar60->name[0x20] = '\0';
      uVar22 = StreamReader<false,_false>::Get<unsigned_short>(&local_8e8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&pTVar60->triangles,(ulong)uVar22);
      if (uVar22 != 0) {
        uVar53 = 0;
        do {
          sVar21 = StreamReader<false,_false>::Get<short>(&local_8e8);
          (pTVar60->triangles).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar53] = (int)sVar21;
          uVar53 = uVar53 + 1;
        } while (uVar22 != uVar53);
      }
      cVar18 = StreamReader<false,_false>::Get<signed_char>(&local_8e8);
      pTVar60->mat = (int)cVar18;
      if (cVar18 == -1) {
        bVar61 = true;
      }
      uVar55 = uVar55 + 1;
    } while (uVar55 != uVar20);
  }
  uVar20 = StreamReader<false,_false>::Get<unsigned_short>(&local_8e8);
  std::
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>::
  vector(&local_918,(ulong)uVar20,(allocator_type *)local_840);
  if (uVar20 != 0) {
    lVar59 = 0;
    do {
      pTVar15 = local_918.
                super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar13 = (undefined8 *)CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current);
      StreamReader<false,_false>::SetPtr(&local_8e8,(int8_t *)(puVar13 + 4));
      pcVar25 = pTVar15->name + lVar59;
      uVar38 = *puVar13;
      uVar10 = puVar13[1];
      uVar11 = puVar13[3];
      *(undefined8 *)(pcVar25 + 0x10) = puVar13[2];
      *(undefined8 *)(pcVar25 + 0x18) = uVar11;
      *(undefined8 *)pcVar25 = uVar38;
      *(undefined8 *)(pcVar25 + 8) = uVar10;
      ambient = (aiColor4D *)((long)&(pTVar15->ambient).r + lVar59);
      *(undefined1 *)&ambient[-0x13].a = 0;
      ReadColor(&local_8e8,ambient);
      ReadColor(&local_8e8,(aiColor4D *)((long)&(pTVar15->diffuse).r + lVar59));
      ReadColor(&local_8e8,(aiColor4D *)((long)&(pTVar15->specular).r + lVar59));
      ReadColor(&local_8e8,(aiColor4D *)((long)&(pTVar15->emissive).r + lVar59));
      fVar62 = StreamReader<false,_false>::Get<float>(&local_8e8);
      *(float *)((long)&pTVar15->shininess + lVar59) = fVar62;
      fVar62 = StreamReader<false,_false>::Get<float>(&local_8e8);
      *(float *)((long)&pTVar15->transparency + lVar59) = fVar62;
      StreamReader<false,_false>::IncPtr(&local_8e8,1);
      pvVar14 = (void *)CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current);
      StreamReader<false,_false>::SetPtr(&local_8e8,(int8_t *)((long)pvVar14 + 0x80));
      memcpy(pTVar15->texture + lVar59,pvVar14,0x80);
      (pTVar15->texture + lVar59)[0x80] = '\0';
      pvVar14 = (void *)CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current);
      StreamReader<false,_false>::SetPtr(&local_8e8,(int8_t *)((long)pvVar14 + 0x80));
      memcpy(pTVar15->alphamap + lVar59,pvVar14,0x80);
      (pTVar15->alphamap + lVar59)[0x80] = '\0';
      lVar59 = lVar59 + 400;
    } while ((ulong)uVar20 * 400 != lVar59);
  }
  fVar62 = StreamReader<false,_false>::Get<float>(&local_8e8);
  StreamReader<false,_false>::Get<float>(&local_8e8);
  StreamReader<false,_false>::Get<unsigned_int>(&local_8e8);
  uVar20 = StreamReader<false,_false>::Get<unsigned_short>(&local_8e8);
  std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
  vector(&local_900,(ulong)uVar20,(allocator_type *)local_840);
  if (uVar20 != 0) {
    uVar55 = 0;
    do {
      pTVar56 = local_900.
                super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar55;
      StreamReader<false,_false>::IncPtr(&local_8e8,1);
      puVar13 = (undefined8 *)CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current);
      StreamReader<false,_false>::SetPtr(&local_8e8,(int8_t *)(puVar13 + 4));
      uVar38 = *puVar13;
      uVar10 = puVar13[1];
      uVar11 = puVar13[3];
      *(undefined8 *)(pTVar56->name + 0x10) = puVar13[2];
      *(undefined8 *)(pTVar56->name + 0x18) = uVar11;
      *(undefined8 *)pTVar56->name = uVar38;
      *(undefined8 *)(pTVar56->name + 8) = uVar10;
      pTVar56->name[0x20] = '\0';
      puVar13 = (undefined8 *)CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current);
      StreamReader<false,_false>::SetPtr(&local_8e8,(int8_t *)(puVar13 + 4));
      uVar38 = *puVar13;
      uVar10 = puVar13[1];
      uVar11 = puVar13[3];
      *(undefined8 *)(pTVar56->parentName + 0x10) = puVar13[2];
      *(undefined8 *)(pTVar56->parentName + 0x18) = uVar11;
      *(undefined8 *)pTVar56->parentName = uVar38;
      *(undefined8 *)(pTVar56->parentName + 8) = uVar10;
      pTVar56->parentName[0x20] = '\0';
      ReadVector(&local_8e8,&pTVar56->rotation);
      ReadVector(&local_8e8,&pTVar56->position);
      sVar21 = StreamReader<false,_false>::Get<short>(&local_8e8);
      std::
      vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
      ::resize(&pTVar56->rotFrames,(long)sVar21);
      sVar21 = StreamReader<false,_false>::Get<short>(&local_8e8);
      std::
      vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
      ::resize(&pTVar56->posFrames,(long)sVar21);
      pTVar45 = (pTVar56->rotFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pTVar56->rotFrames).
          super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar45) {
        uVar54 = 1;
        uVar53 = 0;
        do {
          fVar63 = StreamReader<false,_false>::Get<float>(&local_8e8);
          pTVar45[uVar53].time = fVar63;
          ReadVector(&local_8e8,&pTVar45[uVar53].value);
          uVar53 = (ulong)uVar54;
          pTVar45 = (pTVar56->rotFrames).
                    super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar54 = uVar54 + 1;
        } while (uVar53 < (ulong)((long)(pTVar56->rotFrames).
                                        super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar45
                                 >> 4));
      }
      pTVar45 = (pTVar56->posFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pTVar56->posFrames).
          super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar45) {
        uVar54 = 1;
        uVar53 = 0;
        do {
          fVar63 = StreamReader<false,_false>::Get<float>(&local_8e8);
          pTVar45[uVar53].time = fVar63;
          ReadVector(&local_8e8,&pTVar45[uVar53].value);
          uVar53 = (ulong)uVar54;
          pTVar45 = (pTVar56->posFrames).
                    super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar54 = uVar54 + 1;
        } while (uVar53 < (ulong)((long)(pTVar56->posFrames).
                                        super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar45
                                 >> 4));
      }
      uVar55 = uVar55 + 1;
    } while (uVar55 != uVar20);
  }
  if ((4 < (uint)((int)local_8e8.end - (int)local_8e8.current)) &&
     (uVar54 = StreamReader<false,_false>::Get<unsigned_int>(&local_8e8), uVar54 == 1)) {
    ReadComments<Assimp::MS3DImporter::TempGroup>(this,&local_8e8,&local_8b0);
    ReadComments<Assimp::MS3DImporter::TempMaterial>(this,&local_8e8,&local_918);
    ReadComments<Assimp::MS3DImporter::TempJoint>(this,&local_8e8,&local_900);
    iVar23 = StreamReader<false,_false>::Get<int>(&local_8e8);
    if (iVar23 != 0) {
      iVar23 = StreamReader<false,_false>::Get<int>(&local_8e8);
      if ((ulong)(uint)((int)local_8e8.end - (int)local_8e8.current) < (ulong)(long)iVar23) {
        prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_840._0_8_ = &local_830;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_840,"MS3D: Model comment is too long","");
        std::runtime_error::runtime_error(prVar46,(string *)local_840);
        *(undefined ***)prVar46 = &PTR__runtime_error_0082bce0;
        __cxa_throw(prVar46,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      ppuVar2 = &local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current),
                 (long)iVar23 + CONCAT44(local_8e8.current._4_4_,(int)local_8e8.current));
      pLVar26 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[22]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840,
                 (char (*) [22])"MS3D: Model comment: ");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_840,
                 (char *)local_438[0].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                 (long)local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar26,(char *)local_940);
      if (local_940 != local_930) {
        operator_delete(local_940,local_930[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
      std::ios_base::~ios_base(local_7d0);
      if ((pointer *)
          local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != ppuVar2) {
        operator_delete(local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_438[0].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
    }
    if ((4 < (uint)((int)local_8e8.end - (int)local_8e8.current)) &&
       (uVar54 = StreamReader<false,_false>::Get<unsigned_int>(&local_8e8),
       uVar19 != 0 && (uVar54 & 0xfffffffe) == 2)) {
      lVar59 = 0x20;
      uVar55 = 0;
      do {
        pTVar16 = local_880.
                  super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_880.
        super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar55].weights[3] = 1.0;
        lVar57 = -3;
        do {
          cVar18 = StreamReader<false,_false>::Get<signed_char>(&local_8e8);
          *(int *)((long)pTVar16->bone_id + lVar57 * 4 + lVar59 + -0x10) = (int)cVar18;
          cVar18 = StreamReader<false,_false>::Get<signed_char>(&local_8e8);
          *(float *)((long)pTVar16->bone_id + lVar57 * 4 + lVar59) =
               (float)(uint)(int)cVar18 / 255.0;
          pTVar16[uVar55].weights[3] = pTVar16[uVar55].weights[3] - (float)(uint)(int)cVar18 / 255.0
          ;
          lVar57 = lVar57 + 1;
        } while (lVar57 != 0);
        StreamReader<false,_false>::IncPtr(&local_8e8,(ulong)(uVar54 * 4 - 4));
        uVar55 = uVar55 + 1;
        lVar59 = lVar59 + 0x30;
      } while (uVar55 != uVar19);
    }
  }
  if ((bVar61) &&
     (local_918.
      super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_918.
      super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    pLVar26 = DefaultLogger::get();
    Logger::warn(pLVar26,"MS3D: Found group with no material assigned, spawning default material");
    memset((TempMaterial *)local_840,0,400);
    local_6c8 = 0;
    local_6c0[0]._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)local_6c0;
    std::
    vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ::emplace_back<Assimp::MS3DImporter::TempMaterial>(&local_918,(TempMaterial *)local_840);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_p != local_6c0) {
      operator_delete(local_6d0._M_p,
                      CONCAT71(local_6c0[0]._M_allocated_capacity._1_7_,local_6c0[0]._M_local_buf[0]
                              ) + 1);
    }
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0] = '<';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[1] = 'M';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[2] = 'S';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[3] = '3';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[4] = 'D';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[5] = '_';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[6] = 'D';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[7] = 'e';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[8] = 'f';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[9] = 'a';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[10] = 'u';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xb] = 'l';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xc] = 't';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xd] = 'M';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xe] = 'a';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xf] = 't';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0x10] = '>';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0x11] = '\0';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.r = 0.6;
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.g = 0.6;
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.b = 0.6;
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.a = 1.0;
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].shininess = 0.0;
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].transparency = 1.0;
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].alphamap[0] = '\0';
    local_918.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].texture[0] = '\0';
    if (local_8b0.
        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_8b0.
        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar54 = 1;
      uVar55 = 0;
      do {
        if (local_8b0.
            super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar55].mat == 0xffffffff) {
          local_8b0.
          super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar55].mat =
               (int)((ulong)((long)local_918.
                                   super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_918.
                                  super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x3d70a3d7 - 1
          ;
        }
        uVar55 = (ulong)uVar54;
        uVar53 = ((long)local_8b0.
                        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_8b0.
                        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        uVar54 = uVar54 + 1;
      } while (uVar55 <= uVar53 && uVar53 - uVar55 != 0);
    }
  }
  if ((long)local_918.
            super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_918.
            super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar59 = (long)local_918.
                   super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_918.
                   super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    uVar55 = 0xffffffffffffffff;
    if ((ulong)(lVar59 * -0x70a3d70a3d70a3d7) < 0x2000000000000000) {
      uVar55 = lVar59 * 0x7ae147ae147ae148;
    }
    ppaVar27 = (aiMaterial **)operator_new__(uVar55);
    pScene->mMaterials = ppaVar27;
    if (local_918.
        super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_918.
        super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar59 = 0;
      uVar55 = 0;
      do {
        this_00 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_00);
        pTVar15 = local_918.
                  super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar54 = pScene->mNumMaterials;
        pScene->mNumMaterials = uVar54 + 1;
        pScene->mMaterials[uVar54] = this_00;
        local_840._0_8_ = local_840._0_8_ & 0xffffff0000000000;
        memset(local_840 + 5,0x1b,0x3ff);
        if (pTVar15->alphamap[lVar59] != '\0') {
          local_940 = local_930;
          sVar28 = strlen(pTVar15->alphamap + lVar59);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_940,pTVar15->alphamap + lVar59,
                     pTVar15->alphamap + lVar59 + sVar28);
          plVar12 = local_940;
          sVar28 = local_938 & 0xffffffff;
          if ((local_938 & 0xfffffc00) != 0) {
            sVar28 = 0x3ff;
          }
          local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar28);
          memcpy((void *)((long)&local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4),local_940,sVar28);
          *(undefined1 *)
           ((long)&local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + sVar28 + 4) = 0;
          local_840._0_4_ = (int)sVar28;
          memcpy(local_840 + 4,
                 (void *)((long)&local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4),sVar28);
          local_840[sVar28 + 4] = 0;
          if (plVar12 != local_930) {
            operator_delete(plVar12,local_930[0] + 1);
          }
          aiMaterial::AddProperty(this_00,(aiString *)local_840,"$tex.file",8,0);
        }
        if (pTVar15->texture[lVar59] != '\0') {
          local_940 = local_930;
          sVar28 = strlen(pTVar15->texture + lVar59);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_940,pTVar15->texture + lVar59,
                     pTVar15->texture + lVar59 + sVar28);
          plVar12 = local_940;
          sVar28 = local_938 & 0xffffffff;
          if ((local_938 & 0xfffffc00) != 0) {
            sVar28 = 0x3ff;
          }
          local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar28);
          memcpy((void *)((long)&local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4),local_940,sVar28);
          *(undefined1 *)
           ((long)&local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + sVar28 + 4) = 0;
          local_840._0_4_ = (int)sVar28;
          memcpy(local_840 + 4,
                 (void *)((long)&local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4),sVar28);
          local_840[sVar28 + 4] = 0;
          if (plVar12 != local_930) {
            operator_delete(plVar12,local_930[0] + 1);
          }
          aiMaterial::AddProperty(this_00,(aiString *)local_840,"$tex.file",1,0);
        }
        pcVar25 = pTVar15->name + lVar59;
        if (*pcVar25 != '\0') {
          local_940 = local_930;
          sVar28 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_940,pcVar25,pcVar25 + sVar28);
          plVar12 = local_940;
          sVar28 = local_938 & 0xffffffff;
          if ((local_938 & 0xfffffc00) != 0) {
            sVar28 = 0x3ff;
          }
          local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar28);
          memcpy((void *)((long)&local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4),local_940,sVar28);
          *(undefined1 *)
           ((long)&local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + sVar28 + 4) = 0;
          local_840._0_4_ = (int)sVar28;
          memcpy(local_840 + 4,
                 (void *)((long)&local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4),sVar28);
          local_840[sVar28 + 4] = 0;
          if (plVar12 != local_930) {
            operator_delete(plVar12,local_930[0] + 1);
          }
          aiMaterial::AddProperty(this_00,(aiString *)local_840,"?mat.name",0,0);
        }
        aiMaterial::AddBinaryProperty
                  (this_00,(void *)((long)&(pTVar15->ambient).r + lVar59),0x10,"$clr.ambient",0,0,
                   aiPTI_Float);
        aiMaterial::AddBinaryProperty
                  (this_00,(void *)((long)&(pTVar15->diffuse).r + lVar59),0x10,"$clr.diffuse",0,0,
                   aiPTI_Float);
        aiMaterial::AddBinaryProperty
                  (this_00,(void *)((long)&(pTVar15->specular).r + lVar59),0x10,"$clr.specular",0,0,
                   aiPTI_Float);
        aiMaterial::AddBinaryProperty
                  (this_00,(void *)((long)&(pTVar15->emissive).r + lVar59),0x10,"$clr.emissive",0,0,
                   aiPTI_Float);
        pInput = (float *)((long)&pTVar15->shininess + lVar59);
        aiMaterial::AddBinaryProperty(this_00,pInput,4,"$mat.shininess",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty
                  (this_00,(void *)((long)&pTVar15->transparency + lVar59),4,"$mat.opacity",0,0,
                   aiPTI_Float);
        local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(CONCAT44(local_438[0].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,(uint)(0.0 < *pInput)
                               ) | 2);
        aiMaterial::AddBinaryProperty(this_00,local_438,4,"$mat.shadingm",0,0,aiPTI_Integer);
        uVar55 = uVar55 + 1;
        lVar59 = lVar59 + 400;
      } while (uVar55 < (ulong)(((long)local_918.
                                       super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_918.
                                       super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x70a3d70a3d70a3d7));
    }
  }
  if (local_8b0.
      super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_8b0.
      super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar54 = (int)((long)local_8b0.
                         super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_8b0.
                         super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3b13b13b;
    pScene->mNumMeshes = uVar54;
    uVar55 = (ulong)uVar54 << 3;
    __s = (aiMesh **)operator_new__(uVar55);
    memset(__s,0,uVar55);
    pScene->mMeshes = __s;
    if (pScene->mNumMeshes != 0) {
      p_Var3 = (_Rb_tree_node_base *)(local_840 + 8);
      local_954 = 0;
      do {
        paVar29 = (aiMesh *)operator_new(0x520);
        paVar29->mPrimitiveTypes = 0;
        paVar29->mNumVertices = 0;
        paVar29->mNumFaces = 0;
        memset(&paVar29->mVertices,0,0xcc);
        paVar29->mBones = (aiBone **)0x0;
        paVar29->mMaterialIndex = 0;
        (paVar29->mName).length = 0;
        (paVar29->mName).data[0] = '\0';
        memset((paVar29->mName).data + 1,0x1b,0x3ff);
        paVar29->mNumAnimMeshes = 0;
        paVar29->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar29->mMethod = 0;
        (paVar29->mAABB).mMin.x = 0.0;
        (paVar29->mAABB).mMin.y = 0.0;
        (paVar29->mAABB).mMin.z = 0.0;
        (paVar29->mAABB).mMax.x = 0.0;
        (paVar29->mAABB).mMax.y = 0.0;
        (paVar29->mAABB).mMax.z = 0.0;
        paVar29->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar29->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar29->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar29->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar29->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar29->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar29->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar29->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar29->mNumUVComponents[0] = 0;
        paVar29->mNumUVComponents[1] = 0;
        paVar29->mNumUVComponents[2] = 0;
        paVar29->mNumUVComponents[3] = 0;
        paVar29->mNumUVComponents[4] = 0;
        paVar29->mNumUVComponents[5] = 0;
        paVar29->mNumUVComponents[6] = 0;
        paVar29->mNumUVComponents[7] = 0;
        paVar29->mColors[0] = (aiColor4D *)0x0;
        paVar29->mColors[1] = (aiColor4D *)0x0;
        paVar29->mColors[2] = (aiColor4D *)0x0;
        paVar29->mColors[3] = (aiColor4D *)0x0;
        paVar29->mColors[4] = (aiColor4D *)0x0;
        paVar29->mColors[5] = (aiColor4D *)0x0;
        paVar29->mColors[6] = (aiColor4D *)0x0;
        paVar29->mColors[7] = (aiColor4D *)0x0;
        uVar55 = (ulong)local_954;
        pScene->mMeshes[uVar55] = paVar29;
        if ((pScene->mNumMaterials != 0) &&
           (pScene->mNumMaterials <
            local_8b0.
            super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar55].mat)) {
          prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_840._0_8_ = &local_830;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_840,
                     "MS3D: Encountered invalid material index, file is malformed","");
          std::runtime_error::runtime_error(prVar46,(string *)local_840);
          *(undefined ***)prVar46 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar46,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        local_920 = local_8b0.
                    super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar55;
        paVar29->mMaterialIndex =
             local_8b0.
             super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar55].mat;
        paVar29->mPrimitiveTypes = 4;
        uVar55 = (long)(local_920->triangles).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_920->triangles).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        uVar54 = (uint)uVar55;
        paVar29->mNumFaces = uVar54;
        uVar55 = uVar55 & 0xffffffff;
        puVar30 = (ulong *)operator_new__(uVar55 * 0x10 + 8);
        *puVar30 = uVar55;
        paVar31 = (aiFace *)(puVar30 + 1);
        if (uVar55 != 0) {
          paVar47 = paVar31;
          do {
            paVar47->mNumIndices = 0;
            paVar47->mIndices = (uint *)0x0;
            paVar47 = paVar47 + 1;
          } while (paVar47 != paVar31 + uVar55);
        }
        paVar29->mFaces = paVar31;
        uVar55 = (ulong)(uVar54 * 3);
        paVar29->mNumVertices = uVar54 * 3;
        paVar32 = (aiVector3D *)operator_new__(uVar55 * 0xc);
        if (uVar54 != 0) {
          memset(paVar32,0,((uVar55 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar29->mVertices = paVar32;
        paVar32 = (aiVector3D *)operator_new__(uVar55 * 0xc);
        if (uVar54 != 0) {
          memset(paVar32,0,((uVar55 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar29->mNormals = paVar32;
        uVar55 = (ulong)paVar29->mNumVertices;
        paVar32 = (aiVector3D *)operator_new__(uVar55 * 0xc);
        if (uVar55 != 0) {
          memset(paVar32,0,((uVar55 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar29->mTextureCoords[0] = paVar32;
        paVar29->mNumUVComponents[0] = 2;
        local_840._8_4_ = _S_red;
        local_830._M_allocated_capacity = 0;
        local_818 = 0;
        local_830._8_8_ = p_Var3;
        local_820 = p_Var3;
        if (paVar29->mNumFaces != 0) {
          uVar53 = 0;
          uVar55 = 0;
          do {
            pTVar17 = local_858.
                      super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar58 = (ulong)(local_920->triangles).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar55];
            if ((ulong)(((long)local_858.
                               super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_858.
                               super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333
                       ) < uVar58) {
              prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_438[0].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_438,
                         "MS3D: Encountered invalid triangle index, file is malformed","");
              std::runtime_error::runtime_error(prVar46,(string *)local_438);
              *(undefined ***)prVar46 = &PTR__runtime_error_0082bce0;
              __cxa_throw(prVar46,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            paVar31 = paVar29->mFaces + uVar55;
            paVar31->mNumIndices = 3;
            puVar33 = (uint *)operator_new__(0xc);
            paVar31->mIndices = puVar33;
            lVar59 = 0;
            do {
              pTVar16 = local_880.
                        super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar48 = (ulong)pTVar17[uVar58].indices[lVar59];
              if ((ulong)(((long)local_880.
                                 super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_880.
                                 super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x5555555555555555) < uVar48) {
                prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)&local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_438,
                           "MS3D: Encountered invalid vertex index, file is malformed","");
                std::runtime_error::runtime_error(prVar46,(string *)local_438);
                *(undefined ***)prVar46 = &PTR__runtime_error_0082bce0;
                __cxa_throw(prVar46,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              pTVar1 = local_880.
                       super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar48;
              lVar57 = 0;
              do {
                _Var4 = pTVar16[uVar48].bone_id[lVar57];
                uVar34 = (ulong)_Var4;
                if (uVar34 != 0xffffffff) {
                  uVar49 = ((long)local_900.
                                  super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_900.
                                  super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                           0x2e8ba2e8ba2e8ba3;
                  p_Var50 = p_Var3;
                  uVar38 = local_830._M_allocated_capacity;
                  if (uVar49 < uVar34 || uVar49 - uVar34 == 0) {
                    prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)&local_438[0].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_438,
                               "MS3D: Encountered invalid bone index, file is malformed","");
                    std::runtime_error::runtime_error(prVar46,(string *)local_438);
                    *(undefined ***)prVar46 = &PTR__runtime_error_0082bce0;
                    __cxa_throw(prVar46,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  for (; (_Rb_tree_node_base *)uVar38 != (_Rb_tree_node_base *)0x0;
                      uVar38 = (&((_Rb_tree_node_base *)uVar38)->_M_left)[bVar61]) {
                    bVar61 = ((_Rb_tree_node_base *)(uVar38 + 0x20))->_M_color < _Var4;
                    if (!bVar61) {
                      p_Var50 = (_Rb_tree_node_base *)uVar38;
                    }
                  }
                  p_Var51 = p_Var3;
                  if ((p_Var50 != p_Var3) && (p_Var51 = p_Var50, _Var4 < p_Var50[1]._M_color)) {
                    p_Var51 = p_Var3;
                  }
                  puVar33 = pTVar16[uVar48].bone_id + lVar57;
                  if (p_Var51 == p_Var3) {
                    pmVar35 = std::
                              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                            *)local_840,puVar33);
                    *pmVar35 = 1;
                  }
                  else {
                    pmVar35 = std::
                              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                            *)local_840,puVar33);
                    *pmVar35 = *pmVar35 + 1;
                  }
                }
                lVar57 = lVar57 + 1;
              } while (lVar57 != 4);
              paVar32 = paVar29->mVertices;
              paVar32[uVar53].z = (pTVar1->pos).z;
              fVar63 = (pTVar1->pos).y;
              paVar32 = paVar32 + uVar53;
              paVar32->x = (pTVar1->pos).x;
              paVar32->y = fVar63;
              paVar32 = paVar29->mNormals;
              paVar32[uVar53].z = pTVar17[uVar58].normals[lVar59].z;
              fVar63 = pTVar17[uVar58].normals[lVar59].y;
              paVar32 = paVar32 + uVar53;
              paVar32->x = pTVar17[uVar58].normals[lVar59].x;
              paVar32->y = fVar63;
              fVar63 = pTVar17[uVar58].uv[lVar59].y;
              paVar32 = paVar29->mTextureCoords[0];
              paVar32[uVar53].x = pTVar17[uVar58].uv[lVar59].x;
              paVar32[uVar53].y = 1.0 - fVar63;
              paVar32[uVar53].z = 0.0;
              paVar31->mIndices[lVar59] = (uint)uVar53;
              lVar59 = lVar59 + 1;
              uVar53 = (ulong)((uint)uVar53 + 1);
            } while (lVar59 != 3);
            uVar54 = (int)uVar55 + 1;
            uVar55 = (ulong)uVar54;
          } while (uVar54 < paVar29->mNumFaces);
        }
        if (local_818 != 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (local_438,
                     ((long)local_900.
                            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_900.
                            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3,
                     (allocator_type *)&local_940);
          uVar55 = local_818 * 8;
          if (0x1fffffffffffffff < local_818) {
            uVar55 = 0xffffffffffffffff;
          }
          __s_00 = (aiBone **)operator_new__(uVar55);
          memset(__s_00,0,uVar55);
          paVar29->mBones = __s_00;
          for (uVar38 = local_830._8_8_; (_Rb_tree_node_base *)uVar38 != p_Var3;
              uVar38 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar38)) {
            paVar36 = (aiBone *)operator_new(0x460);
            (paVar36->mName).length = 0;
            (paVar36->mName).data[0] = '\0';
            memset((paVar36->mName).data + 1,0x1b,0x3ff);
            paVar36->mNumWeights = 0;
            paVar36->mWeights = (aiVertexWeight *)0x0;
            (paVar36->mOffsetMatrix).a1 = 1.0;
            (paVar36->mOffsetMatrix).a2 = 0.0;
            (paVar36->mOffsetMatrix).a3 = 0.0;
            (paVar36->mOffsetMatrix).a4 = 0.0;
            (paVar36->mOffsetMatrix).b1 = 0.0;
            (paVar36->mOffsetMatrix).b2 = 1.0;
            (paVar36->mOffsetMatrix).b3 = 0.0;
            (paVar36->mOffsetMatrix).b4 = 0.0;
            (paVar36->mOffsetMatrix).c1 = 0.0;
            (paVar36->mOffsetMatrix).c2 = 0.0;
            (paVar36->mOffsetMatrix).c3 = 1.0;
            (paVar36->mOffsetMatrix).c4 = 0.0;
            (paVar36->mOffsetMatrix).d1 = 0.0;
            (paVar36->mOffsetMatrix).d2 = 0.0;
            (paVar36->mOffsetMatrix).d3 = 0.0;
            (paVar36->mOffsetMatrix).d4 = 1.0;
            paVar29->mBones[paVar29->mNumBones] = paVar36;
            pTVar56 = local_900.
                      super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      ((_Rb_tree_node_base *)(uVar38 + 0x20))->_M_color;
            sVar28 = strlen(pTVar56->name);
            aVar24 = (ai_uint32)sVar28;
            if ((int)aVar24 < 0x400) {
              (paVar36->mName).length = aVar24;
              memcpy((paVar36->mName).data,pTVar56,(long)(int)aVar24);
              (paVar36->mName).data[(int)aVar24] = '\0';
            }
            uVar54 = *(uint *)&((_Rb_tree_node_base *)(uVar38 + 0x20))->field_0x4;
            uVar55 = (ulong)uVar54 * 8;
            paVar37 = (aiVertexWeight *)operator_new__(uVar55);
            if ((ulong)uVar54 != 0) {
              memset(paVar37,0,uVar55);
            }
            paVar36->mWeights = paVar37;
            uVar54 = paVar29->mNumBones;
            paVar29->mNumBones = uVar54 + 1;
            *(uint *)((long)local_438[0].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     (ulong)((_Rb_tree_node_base *)(uVar38 + 0x20))->_M_color * 4) = uVar54;
          }
          if (paVar29->mNumFaces != 0) {
            uVar55 = 0;
            uVar54 = 0;
            do {
              uVar5 = (local_920->triangles).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar55];
              lVar59 = 0;
              do {
                uVar6 = local_858.
                        super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5].indices[lVar59];
                lVar57 = -4;
                do {
                  if ((ulong)(uint)local_880.
                                   super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar6].weights
                                   [lVar57 + -1] != 0xffffffff) {
                    paVar36 = paVar29->mBones
                              [*(uint *)((long)local_438[0].
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        (ulong)(uint)local_880.
                                                                                                          
                                                  super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar6].
                                                  weights[lVar57 + -1] * 4)];
                    paVar37 = paVar36->mWeights;
                    uVar7 = paVar36->mNumWeights;
                    paVar36->mNumWeights = uVar7 + 1;
                    paVar37[uVar7].mVertexId = uVar54;
                    paVar37[uVar7].mWeight =
                         (float)local_880.
                                super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar6 + 1].bone_id
                                [lVar57 + -3];
                  }
                  lVar57 = lVar57 + 1;
                } while (lVar57 != 0);
                lVar59 = lVar59 + 1;
                uVar54 = uVar54 + 1;
              } while (lVar59 != 3);
              uVar55 = uVar55 + 1;
            } while (uVar55 < paVar29->mNumFaces);
          }
          if ((pointer *)
              local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_438[0].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_438[0].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_438[0].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)local_840);
        local_954 = local_954 + 1;
      } while (local_954 < pScene->mNumMeshes);
    }
    this_01 = (aiNode *)operator_new(0x478);
    local_840._0_8_ = &local_830;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"<MS3DRoot>","");
    aiNode::aiNode(this_01,(string *)local_840);
    pScene->mRootNode = this_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._0_8_ != &local_830) {
      operator_delete((void *)local_840._0_8_,(ulong)(local_830._M_allocated_capacity + 1));
    }
    puVar33 = (uint *)operator_new__((ulong)pScene->mNumMeshes << 2);
    this_01->mMeshes = puVar33;
    if (pScene->mNumMeshes != 0) {
      uVar54 = 0;
      do {
        uVar5 = this_01->mNumMeshes;
        this_01->mNumMeshes = uVar5 + 1;
        this_01->mMeshes[uVar5] = uVar54;
        uVar54 = uVar54 + 1;
      } while (uVar54 < pScene->mNumMeshes);
    }
    if (local_900.
        super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_900.
        super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      ppaVar39 = (aiNode **)operator_new__(8);
      *ppaVar39 = (aiNode *)0x0;
      this_01->mChildren = ppaVar39;
      this_01->mNumChildren = 1;
      this_02 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_02);
      *this_01->mChildren = this_02;
      this_02->mParent = this_01;
      CollectChildJoints(this,&local_900,this_02);
      (this_02->mName).length = 0xf;
      builtin_strncpy((this_02->mName).data,"<MS3DJointRoot>",0x10);
      pScene->mNumAnimations = 1;
      ppaVar40 = (aiAnimation **)operator_new__(8);
      pScene->mAnimations = ppaVar40;
      paVar41 = (aiAnimation *)operator_new(0x448);
      (paVar41->mName).length = 0;
      (paVar41->mName).data[0] = '\0';
      memset((paVar41->mName).data + 1,0x1b,0x3ff);
      paVar41->mDuration = -1.0;
      paVar41->mTicksPerSecond = 0.0;
      paVar41->mNumChannels = 0;
      paVar41->mChannels = (aiNodeAnim **)0x0;
      paVar41->mNumMeshChannels = 0;
      paVar41->mMeshChannels = (aiMeshAnim **)0x0;
      paVar41->mNumMorphMeshChannels = 0;
      paVar41->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
      *ppaVar40 = paVar41;
      (paVar41->mName).length = 0x10;
      builtin_strncpy((paVar41->mName).data,"<MS3DMasterAnim>",0x11);
      paVar41->mTicksPerSecond = (double)fVar62;
      lVar59 = (long)local_900.
                     super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_900.
                     super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar55 = 0xffffffffffffffff;
      if ((ulong)(lVar59 * 0x2e8ba2e8ba2e8ba3) < 0x2000000000000000) {
        uVar55 = lVar59 * 0x745d1745d1745d18;
      }
      __s_01 = (aiNodeAnim **)operator_new__(uVar55);
      memset(__s_01,0,uVar55);
      paVar41->mChannels = __s_01;
      for (pTVar56 = local_900.
                     super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pTVar56 !=
          local_900.
          super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          ._M_impl.super__Vector_impl_data._M_finish; pTVar56 = pTVar56 + 1) {
        if (((pTVar56->rotFrames).
             super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pTVar56->rotFrames).
             super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           ((pTVar56->posFrames).
            super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pTVar56->posFrames).
            super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          paVar42 = (aiNodeAnim *)operator_new(0x438);
          (paVar42->mNodeName).length = 0;
          (paVar42->mNodeName).data[0] = '\0';
          memset((paVar42->mNodeName).data + 1,0x1b,0x3ff);
          paVar42->mRotationKeys = (aiQuatKey *)0x0;
          paVar42->mNumScalingKeys = 0;
          *(undefined8 *)&paVar42->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar42->mPositionKeys + 4) = 0;
          paVar42->mScalingKeys = (aiVectorKey *)0x0;
          paVar42->mPreState = aiAnimBehaviour_DEFAULT;
          paVar42->mPostState = aiAnimBehaviour_DEFAULT;
          uVar54 = paVar41->mNumChannels;
          paVar41->mNumChannels = uVar54 + 1;
          paVar41->mChannels[uVar54] = paVar42;
          sVar28 = strlen(pTVar56->name);
          aVar24 = (ai_uint32)sVar28;
          if ((int)aVar24 < 0x400) {
            (paVar42->mNodeName).length = aVar24;
            memcpy((paVar42->mNodeName).data,pTVar56,(long)(int)aVar24);
            (paVar42->mNodeName).data[(int)aVar24] = '\0';
          }
          lVar59 = (long)(pTVar56->rotFrames).
                         super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pTVar56->rotFrames).
                         super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar59 != 0) {
            uVar53 = lVar59 >> 4;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar53;
            uVar55 = SUB168(auVar8 * ZEXT816(0x18),0);
            if (SUB168(auVar8 * ZEXT816(0x18),8) != 0) {
              uVar55 = 0xffffffffffffffff;
            }
            paVar43 = (aiQuatKey *)operator_new__(uVar55);
            paVar52 = paVar43;
            do {
              paVar52->mTime = 0.0;
              (paVar52->mValue).w = 1.0;
              (paVar52->mValue).x = 0.0;
              (paVar52->mValue).y = 0.0;
              (paVar52->mValue).z = 0.0;
              paVar52 = paVar52 + 1;
            } while (paVar52 != paVar43 + uVar53);
            paVar42->mRotationKeys = paVar43;
            for (pTVar45 = (pTVar56->rotFrames).
                           super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pTVar45 !=
                (pTVar56->rotFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_finish; pTVar45 = pTVar45 + 1) {
              paVar52 = paVar42->mRotationKeys;
              uVar54 = paVar42->mNumRotationKeys;
              paVar42->mNumRotationKeys = uVar54 + 1;
              paVar52[uVar54].mTime = (double)(pTVar45->time * fVar62);
              fVar63 = (pTVar56->rotation).x;
              fVar66 = (pTVar56->rotation).y;
              fVar67 = (pTVar56->rotation).z;
              fVar64 = cosf(fVar63);
              fVar65 = sinf(fVar63);
              fVar63 = cosf(fVar66);
              fVar66 = sinf(fVar66);
              local_920 = (pointer)CONCAT44(local_920._4_4_,fVar66);
              fVar66 = cosf(fVar67);
              fVar67 = sinf(fVar67);
              local_884 = fVar63 * fVar66;
              local_888 = local_920._0_4_ * fVar66 * fVar65 - fVar64 * fVar67;
              fVar74 = fVar67 * fVar65 + fVar64 * local_920._0_4_ * fVar66;
              fVar69 = fVar63 * fVar67;
              fVar72 = fVar66 * fVar64 + fVar65 * fVar67 * local_920._0_4_;
              fVar68 = fVar67 * local_920._0_4_ * fVar64 - fVar65 * fVar66;
              fVar65 = fVar65 * fVar63;
              fVar64 = fVar64 * fVar63;
              fVar63 = (pTVar45->value).x;
              fVar66 = (pTVar45->value).y;
              fVar67 = (pTVar45->value).z;
              local_88c = cosf(fVar63);
              fVar63 = sinf(fVar63);
              local_890 = cosf(fVar66);
              fVar66 = sinf(fVar66);
              local_894 = cosf(fVar67);
              fVar67 = sinf(fVar67);
              fVar75 = local_890 * local_894;
              fVar70 = fVar66 * local_894 * fVar63 - local_88c * fVar67;
              fVar73 = fVar67 * fVar63 + local_88c * fVar66 * local_894;
              fVar81 = local_890 * fVar67;
              fVar79 = local_894 * local_88c + fVar63 * fVar67 * fVar66;
              fVar67 = fVar67 * fVar66 * local_88c - fVar63 * local_894;
              fVar63 = fVar63 * local_890;
              fVar82 = local_88c * local_890;
              fVar76 = (fVar75 * local_884 + local_888 * fVar81) - fVar66 * fVar74;
              fVar77 = fVar63 * fVar68 + fVar70 * fVar69 + fVar72 * fVar79;
              fVar71 = fVar76 + 0.0;
              fVar78 = fVar63 * fVar74 + fVar70 * local_884 + local_888 * fVar79 + 0.0;
              fVar80 = fVar74 * fVar82 + local_884 * fVar73 + local_888 * fVar67 + 0.0;
              fVar83 = ((fVar75 * fVar69 + fVar72 * fVar81) - fVar66 * fVar68) + 0.0;
              fVar74 = fVar77 + 0.0;
              fVar69 = fVar68 * fVar82 + fVar69 * fVar73 + fVar72 * fVar67 + 0.0;
              fVar68 = ((fVar81 * fVar65 - fVar75 * local_920._0_4_) - fVar66 * fVar64) + 0.0;
              fVar70 = fVar63 * fVar64 + (fVar79 * fVar65 - fVar70 * local_920._0_4_) + 0.0;
              fVar67 = fVar82 * fVar64 + (fVar67 * fVar65 - fVar73 * local_920._0_4_);
              fVar63 = fVar67 + 0.0;
              fVar66 = fVar71 + fVar74 + fVar63;
              if (fVar66 <= 0.0) {
                if ((fVar76 <= fVar67) || (fVar76 <= fVar77)) {
                  if (fVar77 <= fVar67) {
                    fVar74 = ((fVar63 + 1.0) - fVar71) - fVar74;
                    if (fVar74 < 0.0) {
                      fVar74 = sqrtf(fVar74);
                    }
                    else {
                      fVar74 = SQRT(fVar74);
                    }
                    fVar74 = fVar74 + fVar74;
                    fVar67 = (fVar68 + fVar80) / fVar74;
                    fVar64 = (fVar69 + fVar70) / fVar74;
                    fVar65 = fVar74 * 0.25;
                    fVar66 = (fVar83 - fVar78) / fVar74;
                  }
                  else {
                    fVar63 = ((fVar74 + 1.0) - fVar71) - fVar63;
                    if (fVar63 < 0.0) {
                      fVar63 = sqrtf(fVar63);
                    }
                    else {
                      fVar63 = SQRT(fVar63);
                    }
                    fVar63 = fVar63 + fVar63;
                    fVar67 = (fVar83 + fVar78) / fVar63;
                    fVar64 = fVar63 * 0.25;
                    fVar65 = (fVar69 + fVar70) / fVar63;
                    fVar66 = (fVar80 - fVar68) / fVar63;
                  }
                }
                else {
                  fVar63 = ((fVar71 + 1.0) - fVar74) - fVar63;
                  if (fVar63 < 0.0) {
                    fVar63 = sqrtf(fVar63);
                  }
                  else {
                    fVar63 = SQRT(fVar63);
                  }
                  fVar63 = fVar63 + fVar63;
                  fVar67 = fVar63 * 0.25;
                  fVar64 = (fVar83 + fVar78) / fVar63;
                  fVar65 = (fVar68 + fVar80) / fVar63;
                  fVar66 = (fVar70 - fVar69) / fVar63;
                }
              }
              else {
                fVar66 = fVar66 + 1.0;
                if (fVar66 < 0.0) {
                  fVar66 = sqrtf(fVar66);
                }
                else {
                  fVar66 = SQRT(fVar66);
                }
                fVar66 = fVar66 + fVar66;
                fVar67 = (fVar70 - fVar69) / fVar66;
                fVar64 = (fVar80 - fVar68) / fVar66;
                fVar65 = (fVar83 - fVar78) / fVar66;
                fVar66 = fVar66 * 0.25;
              }
              paVar52[uVar54].mValue.w = fVar66;
              paVar52[uVar54].mValue.x = fVar67;
              paVar52[uVar54].mValue.y = fVar64;
              paVar52[uVar54].mValue.z = fVar65;
            }
          }
          lVar59 = (long)(pTVar56->posFrames).
                         super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pTVar56->posFrames).
                         super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar59 != 0) {
            uVar53 = lVar59 >> 4;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar53;
            uVar55 = SUB168(auVar9 * ZEXT816(0x18),0);
            if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
              uVar55 = 0xffffffffffffffff;
            }
            paVar44 = (aiVectorKey *)operator_new__(uVar55);
            lVar59 = 0;
            do {
              puVar13 = (undefined8 *)((long)&paVar44->mTime + lVar59);
              *puVar13 = 0;
              puVar13[1] = 0;
              *(undefined4 *)((long)&(paVar44->mValue).z + lVar59) = 0;
              lVar59 = lVar59 + 0x18;
            } while (uVar53 * 0x18 != lVar59);
            paVar42->mPositionKeys = paVar44;
            pTVar45 = (pTVar56->posFrames).
                      super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pTVar45 !=
                (pTVar56->posFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                paVar44 = paVar42->mPositionKeys;
                uVar54 = paVar42->mNumPositionKeys;
                paVar42->mNumPositionKeys = uVar54 + 1;
                paVar44[uVar54].mTime = (double)(pTVar45->time * fVar62);
                fVar63 = (pTVar56->position).y;
                fVar66 = (pTVar45->value).y;
                fVar67 = (pTVar56->position).z;
                fVar64 = (pTVar45->value).z;
                paVar44[uVar54].mValue.x = (pTVar56->position).x + (pTVar45->value).x;
                paVar44[uVar54].mValue.y = fVar63 + fVar66;
                paVar44[uVar54].mValue.z = fVar67 + fVar64;
                pTVar45 = pTVar45 + 1;
              } while (pTVar45 !=
                       (pTVar56->posFrames).
                       super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
        }
      }
      if (paVar41->mNumChannels == 0) {
        paVar41->mChannels = (aiNodeAnim **)0x0;
      }
    }
    std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
    ~vector(&local_900);
    std::
    vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ::~vector(&local_918);
    std::vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>::
    ~vector(&local_8b0);
    if (local_858.
        super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_858.
                      super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_858.
                            super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_858.
                            super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_880.
        super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_880.
                      super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_880.
                            super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_880.
                            super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    StreamReader<false,_false>::~StreamReader(&local_8e8);
    return;
  }
  prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_840._0_8_ = &local_830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_840,"MS3D: Didn\'t get any group records, file is malformed","");
  std::runtime_error::runtime_error(prVar46,(string *)local_840);
  *(undefined ***)prVar46 = &PTR__runtime_error_0082bce0;
  __cxa_throw(prVar46,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MS3DImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile,"rb"));

    // CanRead() should have done this already
    char head[10];
    int32_t version;

    mScene = pScene;


    // 1 ------------ read into temporary data structures mirroring the original file

    stream.CopyAndAdvance(head,10);
    stream >> version;
    if (strncmp(head,"MS3D000000",10)) {
        throw DeadlyImportError("Not a MS3D file, magic string MS3D000000 not found: "+pFile);
    }

    if (version != 4) {
        throw DeadlyImportError("MS3D: Unsupported file format version, 4 was expected");
    }

    uint16_t verts;
    stream >> verts;

    std::vector<TempVertex> vertices(verts);
    for (unsigned int i = 0; i < verts; ++i) {
        TempVertex& v = vertices[i];

        stream.IncPtr(1);
        ReadVector(stream,v.pos);
        v.bone_id[0] = stream.GetI1();
        v.ref_cnt = stream.GetI1();

        v.bone_id[1] = v.bone_id[2] = v.bone_id[3] = UINT_MAX;
        v.weights[1] = v.weights[2] = v.weights[3] = 0.f;
        v.weights[0] = 1.f;
    }

    uint16_t tris;
    stream >> tris;

    std::vector<TempTriangle> triangles(tris);
    for (unsigned int i = 0;i < tris; ++i) {
        TempTriangle& t = triangles[i];

        stream.IncPtr(2);
        for (unsigned int i = 0; i < 3; ++i) {
            t.indices[i] = stream.GetI2();
        }

        for (unsigned int i = 0; i < 3; ++i) {
            ReadVector(stream,t.normals[i]);
        }

        for (unsigned int i = 0; i < 3; ++i) {
            stream >> (float&)(t.uv[i].x); // see note in ReadColor()
        }
        for (unsigned int i = 0; i < 3; ++i) {
            stream >> (float&)(t.uv[i].y);
        }

        t.sg    = stream.GetI1();
        t.group = stream.GetI1();
    }

    uint16_t grp;
    stream >> grp;

    bool need_default = false;
    std::vector<TempGroup> groups(grp);
    for (unsigned int i = 0;i < grp; ++i) {
        TempGroup& t = groups[i];

        stream.IncPtr(1);
        stream.CopyAndAdvance(t.name,32);

        t.name[32] = '\0';
        uint16_t num;
        stream >> num;

        t.triangles.resize(num);
        for (unsigned int i = 0; i < num; ++i) {
            t.triangles[i] = stream.GetI2();
        }
        t.mat = stream.GetI1();
        if (t.mat == UINT_MAX) {
            need_default = true;
        }
    }

    uint16_t mat;
    stream >> mat;

    std::vector<TempMaterial> materials(mat);
    for (unsigned int i = 0;i < mat; ++i) {
        TempMaterial& t = materials[i];

        stream.CopyAndAdvance(t.name,32);
        t.name[32] = '\0';

        ReadColor(stream,t.ambient);
        ReadColor(stream,t.diffuse);
        ReadColor(stream,t.specular);
        ReadColor(stream,t.emissive);
        stream >> t.shininess  >> t.transparency;

        stream.IncPtr(1);

        stream.CopyAndAdvance(t.texture,128);
        t.texture[128] = '\0';

        stream.CopyAndAdvance(t.alphamap,128);
        t.alphamap[128] = '\0';
    }

    float animfps, currenttime;
    uint32_t totalframes;
    stream >> animfps >> currenttime >> totalframes;

    uint16_t joint;
    stream >> joint;

    std::vector<TempJoint> joints(joint);
    for(unsigned int i = 0; i < joint; ++i) {
        TempJoint& j = joints[i];

        stream.IncPtr(1);
        stream.CopyAndAdvance(j.name,32);
        j.name[32] = '\0';

        stream.CopyAndAdvance(j.parentName,32);
        j.parentName[32] = '\0';

        ReadVector(stream,j.rotation);
        ReadVector(stream,j.position);

        j.rotFrames.resize(stream.GetI2());
        j.posFrames.resize(stream.GetI2());

        for(unsigned int a = 0; a < j.rotFrames.size(); ++a) {
            TempKeyFrame& kf = j.rotFrames[a];
            stream >> kf.time;
            ReadVector(stream,kf.value);
        }
        for(unsigned int a = 0; a < j.posFrames.size(); ++a) {
            TempKeyFrame& kf = j.posFrames[a];
            stream >> kf.time;
            ReadVector(stream,kf.value);
        }
    }

    if(stream.GetRemainingSize() > 4) {
        uint32_t subversion;
        stream >> subversion;
        if (subversion == 1) {
            ReadComments<TempGroup>(stream,groups);
            ReadComments<TempMaterial>(stream,materials);
            ReadComments<TempJoint>(stream,joints);

            // model comment - print it for we have such a nice log.
            if (stream.GetI4()) {
                const size_t len = static_cast<size_t>(stream.GetI4());
                if (len > stream.GetRemainingSize()) {
                    throw DeadlyImportError("MS3D: Model comment is too long");
                }

                const std::string& s = std::string(reinterpret_cast<char*>(stream.GetPtr()),len);
                ASSIMP_LOG_DEBUG_F("MS3D: Model comment: ", s);
            }

            if(stream.GetRemainingSize() > 4 && inrange((stream >> subversion,subversion),1u,3u)) {
                for(unsigned int i = 0; i < verts; ++i) {
                    TempVertex& v = vertices[i];
                    v.weights[3]=1.f;
                    for(unsigned int n = 0; n < 3; v.weights[3]-=v.weights[n++]) {
                        v.bone_id[n+1] = stream.GetI1();
                        v.weights[n] = static_cast<float>(static_cast<unsigned int>(stream.GetI1()))/255.f;
                    }
                    stream.IncPtr((subversion-1)<<2u);
                }

                // even further extra data is not of interest for us, at least now now.
            }
        }
    }

    // 2 ------------ convert to proper aiXX data structures -----------------------------------

    if (need_default && materials.size()) {
        ASSIMP_LOG_WARN("MS3D: Found group with no material assigned, spawning default material");
        // if one of the groups has no material assigned, but there are other
        // groups with materials, a default material needs to be added (
        // scenepreprocessor adds a default material only if nummat==0).
        materials.push_back(TempMaterial());
        TempMaterial& m = materials.back();

        strcpy(m.name,"<MS3D_DefaultMat>");
        m.diffuse = aiColor4D(0.6f,0.6f,0.6f,1.0);
        m.transparency = 1.f;
        m.shininess = 0.f;

        // this is because these TempXXX struct's have no c'tors.
        m.texture[0] = m.alphamap[0] = '\0';

        for (unsigned int i = 0; i < groups.size(); ++i) {
            TempGroup& g = groups[i];
            if (g.mat == UINT_MAX) {
                g.mat = static_cast<unsigned int>(materials.size()-1);
            }
        }
    }

    // convert materials to our generic key-value dict-alike
    if (materials.size()) {
        pScene->mMaterials = new aiMaterial*[materials.size()];
        for (size_t i = 0; i < materials.size(); ++i) {

            aiMaterial* mo = new aiMaterial();
            pScene->mMaterials[pScene->mNumMaterials++] = mo;

            const TempMaterial& mi = materials[i];

            aiString tmp;
            if (0[mi.alphamap]) {
                tmp = aiString(mi.alphamap);
                mo->AddProperty(&tmp,AI_MATKEY_TEXTURE_OPACITY(0));
            }
            if (0[mi.texture]) {
                tmp = aiString(mi.texture);
                mo->AddProperty(&tmp,AI_MATKEY_TEXTURE_DIFFUSE(0));
            }
            if (0[mi.name]) {
                tmp = aiString(mi.name);
                mo->AddProperty(&tmp,AI_MATKEY_NAME);
            }

            mo->AddProperty(&mi.ambient,1,AI_MATKEY_COLOR_AMBIENT);
            mo->AddProperty(&mi.diffuse,1,AI_MATKEY_COLOR_DIFFUSE);
            mo->AddProperty(&mi.specular,1,AI_MATKEY_COLOR_SPECULAR);
            mo->AddProperty(&mi.emissive,1,AI_MATKEY_COLOR_EMISSIVE);

            mo->AddProperty(&mi.shininess,1,AI_MATKEY_SHININESS);
            mo->AddProperty(&mi.transparency,1,AI_MATKEY_OPACITY);

            const int sm = mi.shininess>0.f?aiShadingMode_Phong:aiShadingMode_Gouraud;
            mo->AddProperty(&sm,1,AI_MATKEY_SHADING_MODEL);
        }
    }

    // convert groups to meshes
    if (groups.empty()) {
        throw DeadlyImportError("MS3D: Didn't get any group records, file is malformed");
    }

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes=static_cast<unsigned int>(groups.size())]();
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {

        aiMesh* m = pScene->mMeshes[i] = new aiMesh();
        const TempGroup& g = groups[i];

        if (pScene->mNumMaterials && g.mat > pScene->mNumMaterials) {
            throw DeadlyImportError("MS3D: Encountered invalid material index, file is malformed");
        } // no error if no materials at all - scenepreprocessor adds one then

        m->mMaterialIndex  = g.mat;
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        m->mFaces = new aiFace[m->mNumFaces = static_cast<unsigned int>(g.triangles.size())];
        m->mNumVertices = m->mNumFaces*3;

        // storage for vertices - verbose format, as requested by the postprocessing pipeline
        m->mVertices = new aiVector3D[m->mNumVertices];
        m->mNormals  = new aiVector3D[m->mNumVertices];
        m->mTextureCoords[0] = new aiVector3D[m->mNumVertices];
        m->mNumUVComponents[0] = 2;

        typedef std::map<unsigned int,unsigned int> BoneSet;
        BoneSet mybones;

        for (unsigned int i = 0,n = 0; i < m->mNumFaces; ++i) {
            aiFace& f = m->mFaces[i];
            if (g.triangles[i]>triangles.size()) {
                throw DeadlyImportError("MS3D: Encountered invalid triangle index, file is malformed");
            }

            TempTriangle& t = triangles[g.triangles[i]];
            f.mIndices = new unsigned int[f.mNumIndices=3];

            for (unsigned int i = 0; i < 3; ++i,++n) {
                if (t.indices[i]>vertices.size()) {
                    throw DeadlyImportError("MS3D: Encountered invalid vertex index, file is malformed");
                }

                const TempVertex& v = vertices[t.indices[i]];
                for(unsigned int a = 0; a < 4; ++a) {
                    if (v.bone_id[a] != UINT_MAX) {
                        if (v.bone_id[a] >= joints.size()) {
                            throw DeadlyImportError("MS3D: Encountered invalid bone index, file is malformed");
                        }
                        if (mybones.find(v.bone_id[a]) == mybones.end()) {
                             mybones[v.bone_id[a]] = 1;
                        }
                        else ++mybones[v.bone_id[a]];
                    }
                }

                // collect vertex components
                m->mVertices[n] = v.pos;

                m->mNormals[n] = t.normals[i];
                m->mTextureCoords[0][n] = aiVector3D(t.uv[i].x,1.f-t.uv[i].y,0.0);
                f.mIndices[i] = n;
            }
        }

        // allocate storage for bones
        if(!mybones.empty()) {
            std::vector<unsigned int> bmap(joints.size());
            m->mBones = new aiBone*[mybones.size()]();
            for(BoneSet::const_iterator it = mybones.begin(); it != mybones.end(); ++it) {
                aiBone* const bn = m->mBones[m->mNumBones] = new aiBone();
                const TempJoint& jnt = joints[(*it).first];

                bn->mName.Set(jnt.name);
                bn->mWeights = new aiVertexWeight[(*it).second];

                bmap[(*it).first] = m->mNumBones++;
            }

            // .. and collect bone weights
            for (unsigned int i = 0,n = 0; i < m->mNumFaces; ++i) {
                TempTriangle& t = triangles[g.triangles[i]];

                for (unsigned int i = 0; i < 3; ++i,++n) {
                    const TempVertex& v = vertices[t.indices[i]];
                    for(unsigned int a = 0; a < 4; ++a) {
                        const unsigned int bone = v.bone_id[a];
                        if(bone==UINT_MAX){
                            continue;
                        }

                        aiBone* const outbone = m->mBones[bmap[bone]];
                        aiVertexWeight& outwght = outbone->mWeights[outbone->mNumWeights++];

                        outwght.mVertexId = n;
                        outwght.mWeight = v.weights[a];
                    }
                }
            }
        }
    }

    // ... add dummy nodes under a single root, each holding a reference to one
    // mesh. If we didn't do this, we'd lose the group name.
    aiNode* rt = pScene->mRootNode = new aiNode("<MS3DRoot>");

#ifdef ASSIMP_BUILD_MS3D_ONE_NODE_PER_MESH
    rt->mChildren = new aiNode*[rt->mNumChildren=pScene->mNumMeshes+(joints.size()?1:0)]();

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiNode* nd = rt->mChildren[i] = new aiNode();

        const TempGroup& g = groups[i];

        // we need to generate an unique name for all mesh nodes.
        // since we want to keep the group name, a prefix is
        // prepended.
        nd->mName = aiString("<MS3DMesh>_");
        nd->mName.Append(g.name);
        nd->mParent = rt;

        nd->mMeshes = new unsigned int[nd->mNumMeshes = 1];
        nd->mMeshes[0] = i;
    }
#else
    rt->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        rt->mMeshes[rt->mNumMeshes++] = i;
    }
#endif

    // convert animations as well
    if(joints.size()) {
#ifndef ASSIMP_BUILD_MS3D_ONE_NODE_PER_MESH
        rt->mChildren = new aiNode*[1]();
        rt->mNumChildren = 1;

        aiNode* jt = rt->mChildren[0] = new aiNode();
#else
        aiNode* jt = rt->mChildren[pScene->mNumMeshes] = new aiNode();
#endif
        jt->mParent = rt;
        CollectChildJoints(joints,jt);
        jt->mName.Set("<MS3DJointRoot>");

        pScene->mAnimations = new aiAnimation*[ pScene->mNumAnimations = 1 ];
        aiAnimation* const anim = pScene->mAnimations[0] = new aiAnimation();

        anim->mName.Set("<MS3DMasterAnim>");

        // carry the fps info to the user by scaling all times with it
        anim->mTicksPerSecond = animfps;

        // leave duration at its default, so ScenePreprocessor will fill an appropriate
        // value (the values taken from some MS3D files seem to be too unreliable
        // to pass the validation)
        // anim->mDuration = totalframes/animfps;

        anim->mChannels = new aiNodeAnim*[joints.size()]();
        for(std::vector<TempJoint>::const_iterator it = joints.begin(); it != joints.end(); ++it) {
            if ((*it).rotFrames.empty() && (*it).posFrames.empty()) {
                continue;
            }

            aiNodeAnim* nd = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
            nd->mNodeName.Set((*it).name);

            if ((*it).rotFrames.size()) {
                nd->mRotationKeys = new aiQuatKey[(*it).rotFrames.size()];
                for(std::vector<TempKeyFrame>::const_iterator rot = (*it).rotFrames.begin(); rot != (*it).rotFrames.end(); ++rot) {
                    aiQuatKey& q = nd->mRotationKeys[nd->mNumRotationKeys++];

                    q.mTime = (*rot).time*animfps;
                    q.mValue = aiQuaternion(aiMatrix3x3(aiMatrix4x4().FromEulerAnglesXYZ((*it).rotation)*
                        aiMatrix4x4().FromEulerAnglesXYZ((*rot).value)));
                }
            }

            if ((*it).posFrames.size()) {
                nd->mPositionKeys = new aiVectorKey[(*it).posFrames.size()];

                aiQuatKey* qu = nd->mRotationKeys;
                for(std::vector<TempKeyFrame>::const_iterator pos = (*it).posFrames.begin(); pos != (*it).posFrames.end(); ++pos,++qu) {
                    aiVectorKey& v = nd->mPositionKeys[nd->mNumPositionKeys++];

                    v.mTime = (*pos).time*animfps;
                    v.mValue = (*it).position + (*pos).value;
                }
            }
        }
        // fixup to pass the validation if not a single animation channel is non-trivial
        if (!anim->mNumChannels) {
            anim->mChannels = NULL;
        }
    }
}